

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

void dumps(LispPTR laddr)

{
  void *NAddr;
  DLword *pDVar1;
  LispPTR LVar2;
  long lVar3;
  
  pDVar1 = Lisp_world;
  for (lVar3 = 0; (int)lVar3 != 0x50; lVar3 = lVar3 + 2) {
    NAddr = (void *)((long)pDVar1 + lVar3 + (ulong)laddr * 2);
    LVar2 = LAddrFromNative(NAddr);
    printf("LADDR 0x%x : %d\n",(ulong)LVar2,(ulong)*(ushort *)((ulong)NAddr ^ 2));
  }
  return;
}

Assistant:

void dumps(LispPTR laddr) {
  int i;
  DLword *ptr;

  ptr = (DLword *)NativeAligned2FromLAddr(laddr);

  for (i = 0; i < 40; i++, ptr++)
    printf("LADDR 0x%x : %d\n", LAddrFromNative(ptr), (GETWORD(ptr) & 0xffff));
}